

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O3

void __thiscall
kj::_::HeapDisposer<kj::EventLoop::LocalMap>::disposeImpl
          (HeapDisposer<kj::EventLoop::LocalMap> *this,void *pointer)

{
  long lVar1;
  undefined8 uVar2;
  long lVar3;
  long lVar4;
  
  if (pointer != (void *)0x0) {
    lVar1 = *(long *)((long)pointer + 0x30);
    if (lVar1 != 0) {
      uVar2 = *(undefined8 *)((long)pointer + 0x38);
      *(undefined8 *)((long)pointer + 0x30) = 0;
      *(undefined8 *)((long)pointer + 0x38) = 0;
      (**(code **)**(undefined8 **)((long)pointer + 0x40))
                (*(undefined8 **)((long)pointer + 0x40),lVar1,8,uVar2,uVar2,0);
    }
    lVar1 = *pointer;
    if (lVar1 != 0) {
      lVar3 = *(long *)((long)pointer + 8);
      lVar4 = *(long *)((long)pointer + 0x10);
      *(undefined8 *)pointer = 0;
      *(undefined8 *)((long)pointer + 8) = 0;
      *(undefined8 *)((long)pointer + 0x10) = 0;
      (**(code **)**(undefined8 **)((long)pointer + 0x18))
                (*(undefined8 **)((long)pointer + 0x18),lVar1,0x18,
                 (lVar3 - lVar1 >> 3) * -0x5555555555555555,
                 (lVar4 - lVar1 >> 3) * -0x5555555555555555,
                 ArrayDisposer::
                 Dispose_<kj::HashMap<const_void_*,_kj::Own<void,_std::nullptr_t>_>::Entry>::
                 destruct);
    }
  }
  operator_delete(pointer,0x48);
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }